

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

int glu::TextureTestUtil::compareGenMipmapVeryLenient
              (ConstPixelBufferAccess *dst,ConstPixelBufferAccess *src,PixelBufferAccess *errorMask,
              GenMipmapPrecision *precision)

{
  byte bVar1;
  char cVar5;
  ushort uVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int y;
  int iVar21;
  int iVar22;
  RGBA *this;
  int y_00;
  int iVar23;
  int iVar24;
  int z;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Vec4 sample;
  Vec4 result;
  RGBA local_a0;
  RGBA local_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [32];
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  PixelBufferAccess *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  iVar18 = (dst->m_size).m_data[1];
  if (iVar18 < 1) {
    iVar22 = 0;
  }
  else {
    iVar23 = (dst->m_size).m_data[0];
    fVar8 = (float)iVar23;
    fVar9 = (float)iVar18;
    fVar10 = (float)(src->m_size).m_data[0];
    fVar11 = (float)(src->m_size).m_data[1];
    iVar22 = 0;
    z = 0;
    local_88._24_8_ = dst;
    local_50 = errorMask;
    do {
      if (0 < iVar23) {
        local_98._0_4_ = (float)z;
        fVar12 = floorf((((float)z + -0.5) / fVar9) * fVar11);
        iVar18 = (int)fVar12;
        fVar12 = ceilf((((float)local_98._0_4_ + 1.5) / fVar9) * fVar11);
        y_00 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_48,(int)dst,y_00,z)
          ;
          local_98._0_4_ = (float)y_00;
          fVar13 = floorf((((float)y_00 + -0.5) / fVar8) * fVar10);
          local_68._0_4_ = fVar13;
          fVar13 = ceilf((((float)local_98._0_4_ + 1.5) / fVar8) * fVar10);
          auVar28 = ZEXT816(0);
          auVar26 = ZEXT816(0);
          if (iVar18 <= (int)fVar12) {
            iVar21 = (int)(float)local_68._0_4_;
            iVar23 = iVar18;
            do {
              if (iVar21 <= (int)fVar13) {
                iVar24 = 0;
                do {
                  iVar19 = iVar21 + iVar24;
                  y = (src->m_size).m_data[0] + -1;
                  if (iVar19 < y) {
                    y = iVar19;
                  }
                  if (iVar19 < 0) {
                    y = 0;
                  }
                  iVar19 = (src->m_size).m_data[1] + -1;
                  if (iVar23 < iVar19) {
                    iVar19 = iVar23;
                  }
                  if (iVar23 < 0) {
                    iVar19 = 0;
                  }
                  _local_98 = auVar28;
                  _local_68 = auVar26;
                  tcu::ConstPixelBufferAccess::getPixel
                            ((ConstPixelBufferAccess *)local_88,(int)src,y,iVar19);
                  if (iVar23 == iVar18 && iVar24 == 0) {
                    auVar26._4_4_ = local_88._4_4_;
                    auVar26._0_4_ = local_88._0_4_;
                    auVar26._8_4_ = local_88._8_4_;
                    auVar26._12_4_ = local_88._12_4_;
                    auVar28 = auVar26;
                  }
                  else {
                    auVar27._0_4_ =
                         local_88._0_4_ & -(uint)((float)local_88._0_4_ <= (float)local_68._0_4_);
                    auVar27._4_4_ =
                         local_88._4_4_ & -(uint)((float)local_88._4_4_ <= (float)local_68._4_4_);
                    auVar27._8_4_ = local_88._8_4_ & -(uint)((float)local_88._8_4_ <= fStack_60);
                    auVar27._12_4_ = local_88._12_4_ & -(uint)((float)local_88._12_4_ <= fStack_5c);
                    auVar25._0_4_ =
                         ~-(uint)((float)local_88._0_4_ <= (float)local_68._0_4_) & local_68._0_4_;
                    auVar25._4_4_ =
                         ~-(uint)((float)local_88._4_4_ <= (float)local_68._4_4_) & local_68._4_4_;
                    auVar25._8_4_ = ~-(uint)((float)local_88._8_4_ <= fStack_60) & (uint)fStack_60;
                    auVar25._12_4_ = ~-(uint)((float)local_88._12_4_ <= fStack_5c) & (uint)fStack_5c
                    ;
                    auVar26 = auVar25 | auVar27;
                    uVar14 = local_88._4_4_ &
                             -(uint)((float)local_98._4_4_ <= (float)local_88._4_4_);
                    uVar15 = local_88._8_4_ & -(uint)(fStack_90 <= (float)local_88._8_4_);
                    uVar16 = local_88._12_4_ & -(uint)(fStack_8c <= (float)local_88._12_4_);
                    auVar28._0_4_ =
                         ~-(uint)((float)local_98._0_4_ <= (float)local_88._0_4_) & local_98._0_4_;
                    auVar28._4_4_ =
                         ~-(uint)((float)local_98._4_4_ <= (float)local_88._4_4_) & local_98._4_4_;
                    auVar28._8_4_ = ~-(uint)(fStack_90 <= (float)local_88._8_4_) & (uint)fStack_90;
                    auVar28._12_4_ = ~-(uint)(fStack_8c <= (float)local_88._12_4_) & (uint)fStack_8c
                    ;
                    auVar7[4] = (char)uVar14;
                    auVar7._0_4_ = local_88._0_4_ &
                                   -(uint)((float)local_98._0_4_ <= (float)local_88._0_4_);
                    auVar7[5] = (char)(uVar14 >> 8);
                    auVar7[6] = (char)(uVar14 >> 0x10);
                    auVar7[7] = (char)(uVar14 >> 0x18);
                    auVar7[8] = (char)uVar15;
                    auVar7[9] = (char)(uVar15 >> 8);
                    auVar7[10] = (char)(uVar15 >> 0x10);
                    auVar7[0xb] = (char)(uVar15 >> 0x18);
                    auVar7[0xc] = (char)uVar16;
                    auVar7[0xd] = (char)(uVar16 >> 8);
                    auVar7[0xe] = (char)(uVar16 >> 0x10);
                    auVar7[0xf] = (char)(uVar16 >> 0x18);
                    auVar28 = auVar28 | auVar7;
                  }
                  iVar19 = iVar21 + iVar24;
                  iVar24 = iVar24 + 1;
                } while (iVar19 + 1 <= (int)fVar13);
              }
              iVar23 = iVar23 + 1;
            } while (iVar23 <= (int)fVar12);
          }
          dst = (ConstPixelBufferAccess *)local_88._24_8_;
          bVar1 = -((char)((byte)(-(uint)(local_48 <= auVar28._0_4_) >> 0x18) &
                          (byte)(-(uint)(auVar26._0_4_ <= local_48) >> 0x18)) >> 7);
          bVar2 = -((char)((byte)(-(uint)(fStack_44 <= auVar28._4_4_) >> 0x18) &
                          (byte)(-(uint)(auVar26._4_4_ <= fStack_44) >> 0x18)) >> 7);
          bVar3 = -((char)((byte)(-(uint)(fStack_40 <= auVar28._8_4_) >> 0x18) &
                          (byte)(-(uint)(auVar26._8_4_ <= fStack_40) >> 0x18)) >> 7);
          bVar4 = -((char)((byte)(-(uint)(fStack_3c <= auVar28._12_4_) >> 0x18) &
                          (byte)(-(uint)(auVar26._12_4_ <= fStack_3c) >> 0x18)) >> 7);
          uVar6 = (ushort)bVar1;
          bVar1 = (uVar6 != 0) * (uVar6 < 0x100) * bVar1 - (0xff < uVar6);
          uVar6 = (ushort)bVar2;
          bVar2 = (uVar6 != 0) * (uVar6 < 0x100) * bVar2 - (0xff < uVar6);
          bVar3 = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
          bVar4 = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
          cVar5 = (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1);
          local_88._0_4_ =
               CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                        CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                 CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                          cVar5)));
          if (cVar5 == '\0') {
LAB_018cf079:
            local_a0.m_value = 0xff0000ff;
            iVar23 = 1;
            this = &local_a0;
          }
          else {
            uVar17 = 0;
            do {
              uVar20 = uVar17;
              if (uVar20 == 3) break;
              uVar17 = uVar20 + 1;
            } while (local_88[uVar20 + 1] != '\0');
            if (uVar20 < 3) goto LAB_018cf079;
            local_9c.m_value = 0xff00ff00;
            iVar23 = 0;
            this = &local_9c;
          }
          iVar22 = iVar22 + iVar23;
          tcu::RGBA::toVec(this);
          tcu::PixelBufferAccess::setPixel(local_50,(Vec4 *)local_88,y_00,z,0);
          y_00 = y_00 + 1;
          iVar23 = ((IVec3 *)((long)dst + 8))->m_data[0];
        } while (y_00 < iVar23);
        iVar18 = ((IVec3 *)((long)dst + 8))->m_data[1];
      }
      z = z + 1;
    } while (z < iVar18);
  }
  return iVar22;
}

Assistant:

static int compareGenMipmapVeryLenient (const tcu::ConstPixelBufferAccess& dst, const tcu::ConstPixelBufferAccess& src, const tcu::PixelBufferAccess& errorMask, const GenMipmapPrecision& precision)
{
	DE_ASSERT(dst.getDepth() == 1 && src.getDepth() == 1); // \todo [2013-10-29 pyry] 3D textures.
	DE_UNREF(precision);

	const float		dstW		= float(dst.getWidth());
	const float		dstH		= float(dst.getHeight());
	const float		srcW		= float(src.getWidth());
	const float		srcH		= float(src.getHeight());
	int				numFailed	= 0;

	for (int y = 0; y < dst.getHeight(); y++)
	for (int x = 0; x < dst.getWidth(); x++)
	{
		const tcu::Vec4	result	= dst.getPixel(x, y);
		const int		minX		= deFloorFloatToInt32(((float)x-0.5f) / dstW * srcW);
		const int		minY		= deFloorFloatToInt32(((float)y-0.5f) / dstH * srcH);
		const int		maxX		= deCeilFloatToInt32(((float)x+1.5f) / dstW * srcW);
		const int		maxY		= deCeilFloatToInt32(((float)y+1.5f) / dstH * srcH);
		tcu::Vec4		minVal, maxVal;
		bool			isOk;

		DE_ASSERT(minX < maxX && minY < maxY);

		for (int ky = minY; ky <= maxY; ky++)
		{
			for (int kx = minX; kx <= maxX; kx++)
			{
				const int		sx		= de::clamp(kx, 0, src.getWidth()-1);
				const int		sy		= de::clamp(ky, 0, src.getHeight()-1);
				const tcu::Vec4	sample	= src.getPixel(sx, sy);

				if (ky == minY && kx == minX)
				{
					minVal = sample;
					maxVal = sample;
				}
				else
				{
					minVal = min(sample, minVal);
					maxVal = max(sample, maxVal);
				}
			}
		}

		isOk = boolAll(logicalAnd(lessThanEqual(minVal, result), lessThanEqual(result, maxVal)));

		errorMask.setPixel(isOk ? tcu::RGBA::green().toVec() : tcu::RGBA::red().toVec(), x, y);
		if (!isOk)
			numFailed += 1;
	}

	return numFailed;
}